

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_Proto3JsonConflictLegacy_Test
::TestBody(ParserValidationErrorTest_Proto3JsonConflictLegacy_Test *this)

{
  ParserTest::ExpectParsesTo
            (&this->super_ParserValidationErrorTest,
             "syntax = \'proto3\';\nmessage TestMessage {\n  option deprecated_legacy_json_field_conflicts = true;\n  uint32 fooBar = 1;\n  uint32 foo_bar = 2;\n}\n"
             ,
             "syntax: \'proto3\'\nmessage_type {\n  name: \'TestMessage\'\n  field {\n    label: LABEL_OPTIONAL type: TYPE_UINT32 name: \'fooBar\' number: 1\n  }\n  field {\n    label: LABEL_OPTIONAL type: TYPE_UINT32 name: \'foo_bar\' number: 2\n  }\n  options {\n    uninterpreted_option {\n      name {\n        name_part: \'deprecated_legacy_json_field_conflicts\'\n        is_extension: false\n      }\n      identifier_value: \'true\'\n    }\n  }\n}\n"
            );
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto3JsonConflictLegacy) {
  ExpectParsesTo(
      "syntax = 'proto3';\n"
      "message TestMessage {\n"
      "  option deprecated_legacy_json_field_conflicts = true;\n"
      "  uint32 fooBar = 1;\n"
      "  uint32 foo_bar = 2;\n"
      "}\n",
      "syntax: 'proto3'\n"
      "message_type {\n"
      "  name: 'TestMessage'\n"
      "  field {\n"
      "    label: LABEL_OPTIONAL type: TYPE_UINT32 name: 'fooBar' number: 1\n"
      "  }\n"
      "  field {\n"
      "    label: LABEL_OPTIONAL type: TYPE_UINT32 name: 'foo_bar' number: 2\n"
      "  }\n"
      "  options {\n"
      "    uninterpreted_option {\n"
      "      name {\n"
      "        name_part: 'deprecated_legacy_json_field_conflicts'\n"
      "        is_extension: false\n"
      "      }\n"
      "      identifier_value: 'true'\n"
      "    }\n"
      "  }\n"
      "}\n");
}